

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::EpsCopyOutputStream::Skip(EpsCopyOutputStream *this,int count,uint8_t **pp)

{
  bool bVar1;
  int iVar2;
  uint8_t *ptr;
  uint uVar3;
  int iVar4;
  int size;
  void *data;
  int local_44;
  uint8_t **local_40;
  uint8_t *local_38;
  
  if (-1 < count) {
    if ((this->had_error_ != true) && (local_44 = Flush(this,*pp), this->had_error_ != true)) {
      local_38 = this->buffer_end_;
      local_40 = pp;
      do {
        iVar4 = count - local_44;
        bVar1 = count < local_44;
        if (iVar4 == 0 || count < local_44) {
          local_38 = local_38 + count;
          uVar3 = local_44 - count;
          if ((int)uVar3 < 0x11) {
            this->end_ = this->buffer_ + (int)uVar3;
            this->buffer_end_ = local_38;
            local_38 = this->buffer_;
          }
          else {
            this->end_ = local_38 + ((ulong)uVar3 - 0x10);
            this->buffer_end_ = (uint8_t *)0x0;
          }
          goto LAB_00231982;
        }
        iVar2 = (*this->stream_->_vptr_ZeroCopyOutputStream[2])(this->stream_,&local_38,&local_44);
        count = iVar4;
      } while ((char)iVar2 != '\0');
      this->had_error_ = true;
      local_38 = this->buffer_;
      this->end_ = this->buffer_ + 0x10;
LAB_00231982:
      *local_40 = local_38;
      return iVar4 == 0 || bVar1;
    }
    *pp = this->buffer_;
  }
  return false;
}

Assistant:

bool EpsCopyOutputStream::Skip(int count, uint8_t** pp) {
  if (count < 0) return false;
  if (had_error_) {
    *pp = buffer_;
    return false;
  }
  int size = Flush(*pp);
  if (had_error_) {
    *pp = buffer_;
    return false;
  }
  void* data = buffer_end_;
  while (count > size) {
    count -= size;
    if (!stream_->Next(&data, &size)) {
      *pp = Error();
      return false;
    }
  }
  *pp = SetInitialBuffer(static_cast<uint8_t*>(data) + count, size - count);
  return true;
}